

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_heap.h
# Opt level: O0

void __thiscall merlin::indexed_heap::max_heapify(indexed_heap *this,size_t i)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 local_30;
  size_t largest;
  size_t right;
  size_t left;
  size_t i_local;
  indexed_heap *this_local;
  
  left = i;
  while( true ) {
    uVar2 = left * 2;
    uVar3 = left * 2 + 1;
    local_30 = left;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&this->m_p);
    if (uVar2 <= sVar4) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_p,uVar2 - 1);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_p,left - 1);
      if (*pvVar5 <= dVar1 && dVar1 != *pvVar5) {
        local_30 = uVar2;
      }
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&this->m_p);
    if (uVar3 <= sVar4) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_p,left * 2);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_p,local_30 - 1);
      if (*pvVar5 <= dVar1 && dVar1 != *pvVar5) {
        local_30 = uVar3;
      }
    }
    if (local_30 == left) break;
    heap_swap(this,local_30,left);
    left = local_30;
  }
  return;
}

Assistant:

void max_heapify(size_t i) {
		for (;;) {
			size_t left = 2 * i, right = 2 * i + 1, largest = i;
			if (left <= m_p.size() && m_p[left - 1] > m_p[largest - 1])
				largest = left;
			if (right <= m_p.size() && m_p[right - 1] > m_p[largest - 1])
				largest = right;
			if (largest == i)
				return;
			heap_swap(largest, i);
			i = largest;
		}
	}